

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ImGuiContext *g;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_98;
  
  pIVar2 = GImGui;
  uVar6 = (ulong)(flags & 1);
  uVar7 = data_type & 0xfffffffe;
  bVar8 = uVar7 == 8;
  bVar9 = power != 1.0;
  uVar3 = v_min - v_max;
  uVar10 = -uVar3;
  if (0 < (int)uVar3) {
    uVar10 = uVar3;
  }
  fVar16 = (&(bb->Min).x)[uVar6];
  fVar1 = (&(bb->Max).x)[uVar6];
  fVar17 = (fVar1 - fVar16) + -4.0;
  fVar15 = (GImGui->Style).GrabMinSize;
  if (uVar7 != 8) {
    fVar14 = fVar17 / (float)(int)(uVar10 + 1);
    uVar3 = -(uint)(fVar15 <= fVar14);
    fVar15 = (float)(~uVar3 & (uint)fVar15 | (uint)fVar14 & uVar3);
  }
  if (fVar17 <= fVar15) {
    fVar15 = fVar17;
  }
  fVar14 = (float)v_min;
  if (v_max * v_min < 0 && (bVar9 && bVar8)) {
    fVar11 = fVar14;
    if (v_min < 0) {
      fVar11 = -fVar14;
    }
    fVar11 = powf(fVar11,1.0 / power);
    fVar12 = (float)v_max;
    if (v_max < 0) {
      fVar12 = -fVar12;
    }
    fVar12 = powf(fVar12,1.0 / power);
    fVar11 = fVar11 / (fVar12 + fVar11);
  }
  else if (v_min < 0) {
    fVar11 = 1.0;
  }
  else {
    fVar11 = 0.0;
  }
  fVar16 = fVar16 + 2.0 + fVar15 * 0.5;
  if (pIVar2->ActiveId == id) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar13 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar12 = IVar13.x;
      if (uVar6 != 0) {
        fVar12 = -IVar13.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar12 != 0.0) || (NAN(fVar12))) {
        fVar18 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar11);
        if ((uVar7 != 8) ||
           (iVar5 = ImParseFormatPrecision(format,3), (bool)(~(bVar9 && bVar8) & iVar5 < 1))) {
          if ((uVar10 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar12 = *(float *)(&DAT_00200c90 + (ulong)(fVar12 < 0.0) * 4) / (float)(int)uVar10;
          }
          else {
            fVar12 = fVar12 / 100.0;
          }
        }
        else {
          fVar12 = fVar12 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar12 = fVar12 / 10.0;
          }
        }
        uVar10 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar12 = (float)(~uVar10 & (uint)fVar12 | (uint)(fVar12 * 10.0) & uVar10);
        if (((fVar18 < 1.0) || (fVar12 <= 0.0)) && ((0.0 < fVar18 || (0.0 <= fVar12)))) {
          fVar18 = fVar18 + fVar12;
          fVar12 = 1.0;
          if (fVar18 <= 1.0) {
            fVar12 = fVar18;
          }
          fVar12 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar12);
          goto LAB_00183158;
        }
      }
    }
    else {
      if (pIVar2->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00182ebb;
      if ((pIVar2->IO).MouseDown[0] != false) {
        fVar12 = 0.0;
        if (0.0 < fVar17 - fVar15) {
          fVar18 = (*(float *)((pIVar2->IO).MouseDown + uVar6 * 4 + -8) - fVar16) /
                   (fVar17 - fVar15);
          fVar12 = 1.0;
          if (fVar18 <= 1.0) {
            fVar12 = fVar18;
          }
          fVar12 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar12);
        }
        if (uVar6 != 0) {
          fVar12 = 1.0 - fVar12;
        }
LAB_00183158:
        if (bVar9 && bVar8) {
          if (fVar11 <= fVar12) {
            uVar10 = -(uint)(1e-06 < ABS(fVar11 + -1.0));
            fVar14 = powf((float)(~uVar10 & (uint)fVar12 |
                                 (uint)((fVar12 - fVar11) / (1.0 - fVar11)) & uVar10),power);
            uVar10 = 0;
            iVar5 = v_max;
            if (0 < v_min) {
              uVar10 = v_min;
            }
          }
          else {
            fVar14 = powf(1.0 - fVar12 / fVar11,power);
            uVar10 = v_max >> 0x1f & v_max;
            iVar5 = v_min;
          }
          iVar5 = (int)((float)(int)(iVar5 - uVar10) * fVar14 + (float)(int)uVar10);
        }
        else if (uVar7 == 8) {
          iVar5 = (int)((float)(v_max - v_min) * fVar12 + fVar14);
        }
        else {
          fVar12 = fVar12 * (float)(v_max - v_min);
          iVar4 = (int)fVar12;
          iVar5 = (int)(fVar12 + 0.5);
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
          iVar5 = iVar5 + v_min;
        }
        iVar5 = RoundScalarWithFormatT<int,int>(format,data_type,iVar5);
        bVar9 = *v != iVar5;
        if (bVar9) {
          *v = iVar5;
        }
        goto LAB_001832bb;
      }
      ClearActiveID();
    }
    bVar9 = false;
  }
  else {
LAB_00182ebb:
    bVar9 = false;
  }
LAB_001832bb:
  if (1.0 <= fVar17) {
    local_98 = -fVar15;
    fVar17 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar11);
    if (uVar6 != 0) {
      fVar17 = 1.0 - fVar17;
    }
    fVar16 = (((fVar1 + -2.0) - fVar15 * 0.5) - fVar16) * fVar17 + fVar16;
    if (uVar6 == 0) {
      fVar1 = (bb->Min).y;
      fVar17 = (bb->Max).y;
      (out_grab_bb->Min).x = local_98 * 0.5 + fVar16;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar15 * 0.5 + fVar16;
      (out_grab_bb->Max).y = fVar17 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = local_98 * 0.5 + fVar16;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar15 * 0.5 + fVar16;
    }
  }
  else {
    IVar13 = bb->Min;
    out_grab_bb->Min = IVar13;
    out_grab_bb->Max = IVar13;
  }
  return bVar9;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}